

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_rcpt_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  void *pvVar1;
  SMTP *smtp;
  SessionHandle *data;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  if (smtpcode / 100 == 2) {
    *(undefined8 *)((long)pvVar1 + 0x10) = *(undefined8 *)(*(long *)((long)pvVar1 + 0x10) + 8);
    if (*(long *)((long)pvVar1 + 0x10) == 0) {
      data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","DATA");
      if (data._4_4_ == CURLE_OK) {
        state(conn,SMTP_DATA);
      }
    }
    else {
      data._4_4_ = smtp_perform_rcpt_to(conn);
    }
  }
  else {
    Curl_failf(conn->data,"RCPT failed: %d",(ulong)(uint)smtpcode);
    data._4_4_ = CURLE_SEND_ERROR;
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_state_rcpt_resp(struct connectdata *conn, int smtpcode,
                                     smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;

  (void)instate; /* no use for this yet */

  if(smtpcode/100 != 2) {
    failf(data, "RCPT failed: %d", smtpcode);
    result = CURLE_SEND_ERROR;
  }
  else {
    smtp->rcpt = smtp->rcpt->next;

    if(smtp->rcpt)
      /* Send the next RCPT TO command */
      result = smtp_perform_rcpt_to(conn);
    else {
      /* Send the DATA command */
      result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s", "DATA");

      if(!result)
        state(conn, SMTP_DATA);
    }
  }

  return result;
}